

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_IHDR(ucvector *out,uint w,uint h,LodePNGColorType colortype,uint bitdepth,
                  uint interlace_method)

{
  uchar *puVar1;
  uint error;
  uchar *data;
  uchar *chunk;
  uint local_28;
  uint interlace_method_local;
  uint bitdepth_local;
  LodePNGColorType colortype_local;
  uint h_local;
  uint w_local;
  ucvector *out_local;
  
  chunk._4_4_ = interlace_method;
  local_28 = bitdepth;
  interlace_method_local = colortype;
  bitdepth_local = h;
  colortype_local = w;
  _h_local = out;
  out_local._4_4_ = lodepng_chunk_init(&data,out,0xd,"IHDR");
  puVar1 = data;
  if (out_local._4_4_ == 0) {
    lodepng_set32bitInt(data + 8,colortype_local);
    lodepng_set32bitInt(puVar1 + 0xc,bitdepth_local);
    puVar1[0x10] = (uchar)local_28;
    puVar1[0x11] = (uchar)interlace_method_local;
    puVar1[0x12] = '\0';
    puVar1[0x13] = '\0';
    puVar1[0x14] = (uchar)chunk._4_4_;
    lodepng_chunk_generate_crc(data);
    out_local._4_4_ = 0;
  }
  return out_local._4_4_;
}

Assistant:

static unsigned addChunk_IHDR(ucvector* out, unsigned w, unsigned h,
                              LodePNGColorType colortype, unsigned bitdepth, unsigned interlace_method) {
  unsigned char *chunk, *data;
  CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 13, "IHDR"));
  data = chunk + 8;

  lodepng_set32bitInt(data + 0, w); /*width*/
  lodepng_set32bitInt(data + 4, h); /*height*/
  data[8] = (unsigned char)bitdepth; /*bit depth*/
  data[9] = (unsigned char)colortype; /*color type*/
  data[10] = 0; /*compression method*/
  data[11] = 0; /*filter method*/
  data[12] = interlace_method; /*interlace method*/

  lodepng_chunk_generate_crc(chunk);
  return 0;
}